

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>::
walkFunctionInModule
          (Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_> *this,
          Function *func,Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  AvoidReinterprets::doWalkFunction((AvoidReinterprets *)(this[-1].stack.fixed._M_elems + 7),func);
  Visitor<wasm::AvoidReinterprets,_void>::visitFunction
            ((Visitor<wasm::AvoidReinterprets,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }